

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

int ucstricmp8(char *utf8,char *utf8end,QChar *utf16,QChar *utf16end)

{
  uchar b;
  char32_t cVar1;
  int iVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  char32_t *output;
  uchar *src1;
  char32_t decoded [1];
  char32_t *local_60;
  QStringIterator local_58;
  uchar *local_40;
  char32_t local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.i = utf16;
  local_58.pos = utf16;
  local_58.e = utf16end;
  local_40 = (uchar *)utf8;
  do {
    if ((utf8end <= local_40) || (local_58.e <= local_58.pos)) {
      iVar2 = (uint)(local_40 < utf8end) - (uint)(local_58.pos < local_58.e);
      break;
    }
    local_34 = L'\xaaaaaaaa';
    b = *local_40;
    local_60 = &local_34;
    local_40 = local_40 + 1;
    qVar3 = QUtf8Functions::fromUtf8<QUtf8BaseTraits,char32_t*,unsigned_char_const*>
                      (b,&local_60,&local_40,(uchar *)utf8end);
    if (qVar3 < 0) {
      local_34 = L'�';
    }
    else {
      local_34 = QChar::toCaseFolded(local_34);
    }
    cVar1 = QStringIterator::next(&local_58,L'�');
    cVar1 = QChar::toCaseFolded(cVar1);
    iVar2 = local_34 - cVar1;
  } while (iVar2 == 0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

Q_NEVER_INLINE static int ucstricmp8(const char *utf8, const char *utf8end, const QChar *utf16, const QChar *utf16end)
{
    auto src1 = reinterpret_cast<const uchar *>(utf8);
    auto end1 = reinterpret_cast<const uchar *>(utf8end);
    QStringIterator src2(utf16, utf16end);

    while (src1 < end1 && src2.hasNext()) {
        char32_t decoded[1];
        char32_t *output = decoded;
        char32_t &uc1 = decoded[0];
        uchar b = *src1++;
        const qsizetype res = QUtf8Functions::fromUtf8<QUtf8BaseTraits>(b, output, src1, end1);
        if (res < 0) {
            // decoding error
            uc1 = QChar::ReplacementCharacter;
        } else {
            uc1 = QChar::toCaseFolded(uc1);
        }

        char32_t uc2 = QChar::toCaseFolded(src2.next());
        int diff = uc1 - uc2;   // can't underflow
        if (diff)
            return diff;
    }

    // the shorter string sorts first
    return (end1 > src1) - int(src2.hasNext());
}